

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

bool __thiscall ReleaseSite::CheckInteraction(ReleaseSite *this,string *name,int reading_frame)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::count(&(this->super_FixedElement).interactions_,name);
  if ((sVar3 != 1) ||
     (iVar1 = (this->super_FixedElement).reading_frame_, bVar2 = true,
     iVar1 != reading_frame && iVar1 != -1)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ReleaseSite::CheckInteraction(const std::string &name, int reading_frame) {
  if (interactions_.count(name) == 1) {
    if (reading_frame_ == -1) {
      return true;
    }
    if (reading_frame == reading_frame_) {
      return true;
    }
  }
  return false;
}